

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

void __thiscall
Diligent::MakeNewRCObj<Diligent::Texture1DArray_GL,_Diligent::FixedBlockMemoryAllocator>::
MakeNewRCObj(MakeNewRCObj<Diligent::Texture1DArray_GL,_Diligent::FixedBlockMemoryAllocator> *this,
            FixedBlockMemoryAllocator *Allocator,Char *Description,char *FileName,Int32 LineNumber,
            IObject *pOwner)

{
  IObject *pOwner_local;
  Int32 LineNumber_local;
  char *FileName_local;
  Char *Description_local;
  FixedBlockMemoryAllocator *Allocator_local;
  MakeNewRCObj<Diligent::Texture1DArray_GL,_Diligent::FixedBlockMemoryAllocator> *this_local;
  
  this->m_pAllocator = Allocator;
  this->m_pOwner = pOwner;
  this->m_dvpDescription = Description;
  this->m_dvpFileName = FileName;
  this->m_dvpLineNumber = LineNumber;
  return;
}

Assistant:

MakeNewRCObj(AllocatorType& Allocator, const Char* Description, const char* FileName, const Int32 LineNumber, IObject* pOwner = nullptr) noexcept :
        // clang-format off
        m_pAllocator{&Allocator},
        m_pOwner{pOwner}
#ifdef DILIGENT_DEVELOPMENT
      , m_dvpDescription{Description}
      , m_dvpFileName   {FileName   }
      , m_dvpLineNumber {LineNumber }
    // clang-format on
#endif
    {
    }